

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

void __thiscall libDAI::NDP::EliminateVariable(NDP *this,size_t i_th_var)

{
  unsigned_long *__src;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  TFactor<double> *this_00;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  pointer puVar1;
  pointer pvVar2;
  pointer pTVar3;
  unsigned_long uVar4;
  iterator __position;
  unsigned_long *puVar5;
  pointer puVar6;
  size_type __n;
  pointer pVVar7;
  pointer pIVar8;
  int iVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  Factor *pFVar11;
  unsigned_long uVar12;
  undefined4 extraout_var_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __dest;
  undefined8 *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  nb_type *n;
  nb_type *n_00;
  ulong uVar17;
  long lVar18;
  unsigned_long uVar19;
  ulong uVar20;
  double dVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  VarSet vs_F;
  VarSet neighVs;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> vs_vec;
  vector<libDAI::Index,_std::allocator<libDAI::Index>_> index_vec;
  Factor sliced_Fi;
  long local_308;
  size_t local_300;
  nb_type local_2f8;
  size_type local_2e0;
  Var *local_2d8;
  pointer local_2d0;
  pointer local_2c8;
  NDP *local_2c0;
  pointer local_2b8;
  long local_2b0;
  long local_2a8;
  TFactor<double> local_2a0;
  VarSet local_268;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> local_248;
  vector<libDAI::Index,_std::allocator<libDAI::Index>_> local_230;
  ulong local_218;
  ulong local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_190;
  pointer local_50;
  
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Starting elimination of ",0x18);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-th var...",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  puVar1 = (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar17 = i_th_var;
  if (i_th_var <
      (ulong)((long)(this->_m_varOrder).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    uVar17 = puVar1[i_th_var];
    iVar9 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    local_2d8 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x30))
                                 ((long *)CONCAT44(extraout_var,iVar9),uVar17);
    pvVar2 = (this->_m_neighV).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(this->_m_neighV).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
             -0x5555555555555555;
    if (uVar17 <= uVar16 && uVar16 - uVar17 != 0) {
      local_2c8 = pvVar2[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_2d0 = pvVar2[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218 = uVar17;
      GetVNeighsV((nb_type *)local_1d8,this,uVar17);
      puVar6 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar1 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._M_allocated_capacity;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
      local_1d8._0_8_ = (pointer)0x0;
      local_1d8._8_8_ = (_Base_ptr)0x0;
      local_1c8._M_allocated_capacity = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar6 - (long)puVar1);
      }
      if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity - local_1d8._0_8_);
      }
      VarSetFromNB(&local_268,this,&local_2f8);
      __x = pvVar2 + uVar17;
      local_2e0 = (long)local_2d0 - (long)local_2c8 >> 3;
      uVar17 = (long)local_268._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_268._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4;
      if (1 < (this->Props).verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"it praticipates in ",0x13);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," factors",8);
        if (2 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0,__x);
          printNB_abi_cxx11_((string *)local_1d8,(NDP *)local_1f0,n);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1d8._0_8_,local_1d8._8_8_);
          if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
            operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)local_1f0._0_8_ != (_Base_ptr)0x0) {
            operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ - local_1f0._0_8_);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"it has ",7);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," variables neighbors",0x14);
        if (2 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_208,&local_2f8);
          printNB_abi_cxx11_((string *)local_1d8,(NDP *)&local_208,n_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1d8._0_8_,local_1d8._8_8_);
          if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
            operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
          }
          if ((_func_int **)
              local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_208.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_208.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_208.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      if ((this->_m_induced_width < uVar17) &&
         (this->_m_induced_width = uVar17, (this->Props).verbose != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Induced width increased to ",0x1b);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      TFactor<double>::TFactor((TFactor<double> *)local_1d8,&local_268);
      pTVar3 = (this->_m_newFacs).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(this->_m_newFacs).
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
               0x6db6db6db6db6db7;
      if (uVar17 < i_th_var || uVar17 - i_th_var == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   i_th_var);
      }
      TFactor<double>::operator=(pTVar3 + i_th_var,(TFactor<double> *)local_1d8);
      if (local_1b8 != (pointer)0x0) {
        operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity - local_1d8._0_8_);
      }
      __n = local_2e0;
      pTVar3 = (this->_m_newFacs).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(this->_m_newFacs).
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
               0x6db6db6db6db6db7;
      if (i_th_var <= uVar17 && uVar17 - i_th_var != 0) {
        SetNeighF(this,i_th_var,&local_268);
        pvVar2 = (this->_m_bestResps).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = ((long)(this->_m_bestResps).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                 -0x5555555555555555;
        if (i_th_var <= uVar17 && uVar17 - i_th_var != 0) {
          local_2b0 = i_th_var * 3;
          local_2b8 = pTVar3 + i_th_var;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (pvVar2 + i_th_var,
                     (long)(local_2b8->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&(local_2b8->_p)._p.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl >> 3);
          std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::vector
                    (&local_230,__n,(allocator_type *)local_1d8);
          std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
                    (&local_248,__n,(allocator_type *)local_1d8);
          local_2c0 = this;
          if (local_2d0 != local_2c8) {
            local_210 = local_2e0 + (local_2e0 == 0);
            local_2a8 = 0;
            local_308 = 0;
            uVar17 = 0;
            do {
              puVar1 = (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(__x->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
                  uVar17) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar17);
              }
              pFVar11 = GetFactor(this,puVar1[uVar17]);
              std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                        ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_2a0,
                         (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)pFVar11);
              local_2a0._vs._statespace = (pFVar11->_vs)._statespace;
              VarSet::operator/=(&local_2a0._vs,local_2d8);
              pVVar7 = local_248.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              this = local_2c0;
              if ((ulong)((long)local_248.
                                super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_248.
                                super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar17);
              }
              this_00 = (TFactor<double> *)
                        ((long)&((local_248.
                                  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vars).
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start + local_308);
              if (this_00 != &local_2a0) {
                std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator=
                          ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this_00,
                           (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_2a0);
                *(size_t *)((long)&pVVar7->_statespace + local_308) = local_2a0._vs._statespace;
              }
              Index::Index((Index *)local_1d8,&local_2a0._vs,&local_268);
              uVar16 = ((long)local_230.
                              super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_230.
                              super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
              if (uVar16 < uVar17 || uVar16 - uVar17 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar17);
              }
              Index::operator=((Index *)((long)&(local_230.
                                                 super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->_index
                                        + local_2a8),(Index *)local_1d8);
              if (local_1a0 != (pointer)0x0) {
                operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
              }
              if (local_1b8 != (pointer)0x0) {
                operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
              }
              if ((_Base_ptr)local_1d8._8_8_ != (_Base_ptr)0x0) {
                operator_delete((void *)local_1d8._8_8_,local_1c8._8_8_ - local_1d8._8_8_);
              }
              if (local_2a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2a0._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2a0._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_2a0._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              uVar17 = uVar17 + 1;
              local_308 = local_308 + 0x20;
              local_2a8 = local_2a8 + 0x50;
            } while (local_210 != uVar17);
          }
          if (local_268._statespace != 0) {
            uVar16 = local_2e0 + (local_2e0 == 0);
            uVar17 = 0;
            do {
              VarSet::VarSet((VarSet *)local_1d8,local_2d8);
              TFactor<double>::TFactor(&local_2a0,(VarSet *)local_1d8,0.0);
              if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_1d8._0_8_,
                                local_1c8._M_allocated_capacity - local_1d8._0_8_);
              }
              if (local_2d0 != local_2c8) {
                uVar20 = 0;
                do {
                  puVar1 = (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(__x->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)
                      <= uVar20) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar20);
                  }
                  pFVar11 = GetFactor(this,puVar1[uVar20]);
                  pIVar8 = local_230.
                           super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  uVar14 = (long)local_248.
                                 super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_248.
                                 super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                  if (uVar14 <= uVar20) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar20,uVar14);
                  }
                  uVar14 = ((long)local_230.
                                  super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_230.
                                  super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 4) *
                           -0x3333333333333333;
                  if (uVar14 < uVar20 || uVar14 - uVar20 == 0) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar20,uVar14);
                  }
                  TFactor<double>::slice
                            ((Factor *)local_1d8,pFVar11,
                             local_248.
                             super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar20,
                             local_230.
                             super__Vector_base<libDAI::Index,_std::allocator<libDAI::Index>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar20]._index);
                  if ((long)local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start != 0) {
                    lVar15 = (long)local_2a0._p._p.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_2a0._p._p.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3;
                    lVar18 = 0;
                    do {
                      local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18] =
                           local_1b8[lVar18] +
                           local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar18];
                      lVar18 = lVar18 + 1;
                    } while (lVar15 + (ulong)(lVar15 == 0) != lVar18);
                  }
                  Index::operator++(pIVar8 + uVar20);
                  if (local_1b8 != (pointer)0x0) {
                    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
                  }
                  this = local_2c0;
                  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_1d8._0_8_,
                                    local_1c8._M_allocated_capacity - local_1d8._0_8_);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar16);
              }
              uVar4 = local_2d8->_states;
              if ((long)local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3 != uVar4) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1d8 + 0x10),"contribution_vec_v.stateSpace() = ",0x22);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1d8 + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," != v.states() = ",0x11)
                ;
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::endl<char,std::char_traits<char>>(poVar10);
                puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                std::__cxx11::stringbuf::str();
                *puVar13 = local_50;
                __cxa_throw(puVar13,&char_const*::typeinfo,0);
              }
              if (uVar4 == 0) {
                uVar22 = 0xffefffffffffffff;
                uVar12 = 0;
              }
              else {
                uVar19 = 0;
                uVar12 = 0;
                auVar23 = ZEXT816(0xffefffffffffffff);
                do {
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ =
                       local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar19];
                  dVar21 = auVar23._0_8_;
                  auVar23 = vmaxsd_avx(auVar24,auVar23);
                  uVar22 = auVar23._0_8_;
                  if (dVar21 < local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar19]) {
                    uVar12 = uVar19;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar4 != uVar19);
              }
              *(undefined8 *)
               (*(long *)&(local_2b8->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl + uVar17 * 8) = uVar22;
              pvVar2 = (this->_m_bestResps).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar20 = ((long)(this->_m_bestResps).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                       -0x5555555555555555;
              local_300 = i_th_var;
              if ((uVar20 < i_th_var || uVar20 - i_th_var == 0) ||
                 (puVar1 = (&(pvVar2->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start)[local_2b0],
                 local_300 = uVar17,
                 (ulong)((long)(&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish)[local_2b0] -
                         (long)puVar1 >> 3) <= uVar17)) {
LAB_004e47a9:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,local_300);
              }
              puVar1[uVar17] = uVar12;
              if (3 < (this->Props).verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"best-response for ",0x12);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"-th \'local state\' is ",0x15);
                pvVar2 = (this->_m_bestResps).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar20 = ((long)(this->_m_bestResps).
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                         -0x5555555555555555;
                local_300 = i_th_var;
                if ((uVar20 < i_th_var || uVar20 - i_th_var == 0) ||
                   (local_300 = uVar17,
                   (ulong)((long)(&(pvVar2->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish)[local_2b0] -
                           (long)(&(pvVar2->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start)[local_2b0] >> 3) <=
                   uVar17)) goto LAB_004e47a9;
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," (value = ",10);
                poVar10 = std::ostream::_M_insert<double>
                                    (*(double *)
                                      (*(long *)&(local_2b8->_p)._p.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl + uVar17 * 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
              if (local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2a0._p._p.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2a0._p._p.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2a0._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2a0._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_2a0._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < local_268._statespace);
          }
          if (6 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "New factor (and best-responses) computed, updating neighbors...",0x3f);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
          }
          if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar17 = 0;
            do {
              uVar16 = *(ulong *)((_Rb_tree_color *)
                                  local_2f8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar17 * 2);
              pvVar2 = (this->_m_neighV).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar20 = ((long)(this->_m_neighV).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                       -0x5555555555555555;
              if (uVar20 < uVar16 || uVar20 - uVar16 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar16);
              }
              iVar9 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[9])();
              this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar2 + uVar16);
              local_1d8._0_8_ = CONCAT44(extraout_var_00,iVar9) + i_th_var;
              __position._M_current = *(unsigned_long **)(this_01 + 8);
              if (__position._M_current == *(unsigned_long **)(this_01 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          (this_01,__position,(unsigned_long *)local_1d8);
              }
              else {
                *__position._M_current = local_1d8._0_8_;
                *(unsigned_long **)(this_01 + 8) = __position._M_current + 1;
              }
              if ((__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar16 = 0;
                do {
                  puVar1 = (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(__x->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)
                      <= uVar16) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar16);
                  }
                  local_2a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)puVar1[uVar16];
                  __dest = std::
                           __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                     (*(undefined8 *)this_01,*(undefined8 *)(this_01 + 8),&local_2a0
                                     );
                  puVar5 = *(unsigned_long **)(this_01 + 8);
                  if (__dest._M_current != puVar5) {
                    __src = __dest._M_current + 1;
                    if (__src != puVar5) {
                      memmove(__dest._M_current,__src,(long)puVar5 - (long)__src);
                    }
                    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + -8;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 < (ulong)((long)(__x->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(__x->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 3));
              }
              uVar17 = uVar17 + 1;
              this = local_2c0;
            } while (uVar17 < (ulong)((long)local_2f8.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2f8.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (1 < (this->Props).verbose) {
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"-th variable (varIndex=",0x17);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") has been eliminated",0x15)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
          std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_248);
          std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::~vector(&local_230);
          if (local_268._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_268._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_268._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_268._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((_Base_ptr)
              local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            operator_delete(local_2f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2f8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2f8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 i_th_var);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17);
}

Assistant:

void NDP::EliminateVariable(size_t i_th_var)
    {
        if(Props.verbose >= 1)
            cout << "Starting elimination of "<<i_th_var<<"-th var..."<<endl;

        size_t varIndex = _m_varOrder.at(i_th_var);
        const FactorGraph& g = grm();

        //this has been replaced by the GetFactor function that 
        //generalizes to refer to *all* (orig+ new) factors
        //const std::vector < Factor > & 	facs = g.factors();

        //get ref the the variable 
        const Var & v = g.var(varIndex);

        //get all the factors of the var - use the local 'GetNeighsV' function!
        //(since that include newly constructed factors, and only factors
        //that are still in consideration)
        const FactorGraph::nb_type &  neighFIs = GetNeighsV(varIndex);
        size_t num_Fs = neighFIs.size();
            if(Props.verbose >= 1)

        vector<size_t> neighVIs2;

        //get all the (indices of) neighbors of those, the 'neighVIs2' 
        //!??!? I used 'neighVIs' but that gave compiler errors?!?
        nb_type neighVIs2;
        //cout << printNB(neighVIs2);
        neighVIs2 = GetVNeighsV(varIndex);
        //get all the neighbors of those, the 'neighVs' 
        VarSet neighVs = VarSetFromNB(neighVIs2);
        size_t num_Vs = neighVs.size();
        if(Props.verbose >= 2)
        {
            cout << "it praticipates in "<<num_Fs << " factors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighFIs);
            cout <<endl;
            cout << "it has "<<num_Vs << " variables neighbors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighVIs2);
            cout <<endl;
        }
        if(num_Vs > _m_induced_width)
        {
            _m_induced_width = num_Vs;
            if(Props.verbose >= 1)
                cout << "Induced width increased to "<<_m_induced_width<<endl;
        }

        //the new factor will include all these neighVs:
        _m_newFacs.at(i_th_var) = Factor(neighVs);
        Factor& newFactor = _m_newFacs.at(i_th_var);
        SetNeighF(i_th_var, neighVs);

        //and we will need to keep track of the best-responses
        //of this variable v
        _m_bestResps.at(i_th_var).resize( newFactor.stateSpace() );

        //loop over all states of neighVs, compute v's best response
        //and store as a new factor.
        
        //make an index(vs_F, neighVs) for each factor F in neighFs
        vector< Index > index_vec(num_Fs);
        vector< VarSet > vs_vec(num_Fs);
        for(size_t i=0; i < num_Fs; i++)
        {
            size_t fI = neighFIs.at(i);
            const Factor& F = GetFactor( fI );
            VarSet vs_F = F.vars();
            //remove variable varIndex:
            vs_F /= v;
            vs_vec.at(i) = vs_F;
            index_vec.at(i) = Index(vs_F, neighVs);
        }
        for( size_t jI=0; jI < neighVs.stateSpace(); jI++)
        {//compute best response against joint state jI.
            //here we will store the amount that v can achieve by
            //selecting each of its states when neighVs have state jI:
            Factor contribution_vec_v(v, 0.0);

            //loop over all neighFs
            //-get the slice that corresponds to the assignment of 'states'
            // according to jI (this should be a vector of v's states)
            //-add to contribution_vec_v 
            for(size_t i=0; i < num_Fs; i++)
            {
                //process the i-th neighboring factor, corresponding to 
                size_t fI = neighFIs.at(i);
                const Factor& f = GetFactor( fI );
                VarSet & vs_i = vs_vec.at(i);
                Index & index_i = index_vec.at(i);
                Factor sliced_Fi = f.slice( vs_i, index_i);
                //sliced_Fi should be a factor depending only on v now...
                //and thus we add it to the contribution_vec_v
                contribution_vec_v += sliced_Fi;
                
                //update its index:
                ++index_i;
            }

            //sanity check:
            if( contribution_vec_v.stateSpace() != v.states() )
            {
                stringstream ss;
                ss << "contribution_vec_v.stateSpace() = "<<
                   contribution_vec_v.stateSpace() <<
                   " != v.states() = "<< 
                   v.states() << endl;

                throw ( ss.str().c_str() );
            }

            //now the state of v that has the highest value in 
            //contribution_vec_v is the best response:
            double val = -DBL_MAX;
            size_t brI = 0;
            for(size_t i=0; i < v.states() ; i++)
                if( contribution_vec_v[i] > val)
                {
                    val = contribution_vec_v[i];
                    brI = i;
                }
            
            newFactor[jI] = val;
            _m_bestResps.at(i_th_var).at(jI) = brI;

            if(Props.verbose >= 4)
                cout << "best-response for "<<jI<<"-th 'local state' is "<<
                    _m_bestResps.at(i_th_var).at(jI) << " (value = "<<
                    newFactor[jI] <<")"<<endl;

        }
        if(Props.verbose >= 7)
            cout << "New factor (and best-responses) computed, updating neighbors..."<<
               endl; 

        //update: _m_neighV
        //-> the factors with indices 'neighFIs' have been removed
        //-> these factors have been replaced by 
        //      'newFactor = _m_newFacs.at(i_th_var)'
        //   whose global index is given by 
        //      gI = ToGlobalFactorIndex(i_th_var)
        //
        //-> the variables in Varset  'neighVs'  are affected by that
        //      - remove old factor indices
        //      - add gI
        
        for(size_t i=0; i < neighVIs2.size(); i++)
        {
            size_t vI = neighVIs2.at(i);
            nb_type & nb_vI = _m_neighV.at(vI);
            
            //add new factor to nb_vI
            size_t gI = ToGlobalFactorIndex(i_th_var);
            nb_vI.push_back(gI);

            //remove indices from neighFIs
            for(size_t j=0; j<neighFIs.size(); j++)
            {
                size_t fI = neighFIs.at(j);
                //check if fI in nb_vI
                //     std::find(vector.begin(), vector.end(), item)!=vector.end()
                nb_type::iterator pos = std::find(
                        nb_vI.begin(),
                        nb_vI.end(),
                        fI);
                //i guess it will do not harm if pos==end() ?
                //nb_vI.erase(pos);
                //well the segfault indicates otherwise:
                if(pos != nb_vI.end())
                    nb_vI.erase(pos);
            }
        }

        //update _m_neighF
        //-> remove this agent from any neighborhood
        //-> but is not necessary... all its factors have been removed!

        if(Props.verbose >= 2)
            cout << i_th_var<<"-th variable (varIndex="<<varIndex<<
                ") has been eliminated"<<endl;

    }